

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseQuotedText(WastParser *this,string *text)

{
  char c;
  bool bVar1;
  Result RVar2;
  string *psVar3;
  char cVar4;
  value_type *__value;
  value_type *pvVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 auStack_a8 [8];
  Token token;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  uint32_t hi;
  allocator_type local_34 [8];
  uint32_t lo;
  
  bVar1 = PeekMatch(this,Text);
  if (bVar1) {
    Consume((Token *)auStack_a8,this);
    psVar3 = Token::text_abi_cxx11_((Token *)auStack_a8);
    token.field_2._32_8_ = (psVar3->_M_dataplus)._M_p;
    unique0x10000334 = psVar3->_M_string_length;
    if (2 < psVar3->_M_string_length) {
      join_0x00000010_0x00000000_ =
           string_view::substr((string_view *)((long)&token.field_2.literal_.text.field_2 + 8),1,
                               psVar3->_M_string_length - 2);
      __value = token.field_2._32_8_;
      pvVar5 = __value + token._80_8_;
      for (; __value < pvVar5; __value = __value + 1) {
        if (*__value == '\\') {
          c = __value[1];
          cVar4 = c;
          if (((c != '\"') && (c != '\'')) && (c != '\\')) {
            if (c == 't') {
              cVar4 = '\t';
            }
            else if (c == 'r') {
              cVar4 = '\r';
            }
            else {
              cVar4 = '\n';
              if (c != 'n') {
                RVar2 = ParseHexdigit(c,(uint32_t *)&local_40);
                if ((RVar2.enum_ != Ok) ||
                   (RVar2 = ParseHexdigit(__value[2],(uint32_t *)local_34), RVar2.enum_ != Ok)) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                                ,0x55,
                                "void wabt::(anonymous namespace)::RemoveEscapes(string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::basic_string<char>>]"
                               );
                }
                std::__cxx11::string::push_back
                          ((string *)text,
                           (byte)((int)local_40.container << 4) | (byte)local_34._0_4_);
                __value = __value + 2;
                goto LAB_00da5b0d;
              }
            }
          }
          std::__cxx11::string::push_back((string *)text,cVar4);
          __value = __value + 1;
        }
        else {
          local_40.container = text;
          std::
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(&local_40,__value);
        }
LAB_00da5b0d:
      }
    }
    bVar1 = IsValidUtf8((text->_M_dataplus)._M_p,text->_M_string_length);
    if (!bVar1) {
      Error(this,0x101f036);
    }
    Token::~Token((Token *)auStack_a8);
    RVar2.enum_ = Ok;
  }
  else {
    std::__cxx11::string::string((string *)auStack_a8,"a quoted string",(allocator *)&local_40);
    __l._M_len = 1;
    __l._M_array = (iterator)auStack_a8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&token.field_2.literal_.text.field_2 + 8),__l,local_34);
    RVar2 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)&token.field_2.literal_.text.field_2 + 8),"\"foo\"");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&token.field_2.literal_.text.field_2 + 8));
    std::__cxx11::string::~string((string *)auStack_a8);
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result WastParser::ParseQuotedText(std::string* text) {
  WABT_TRACE(ParseQuotedText);
  if (!PeekMatch(TokenType::Text)) {
    return ErrorExpected({"a quoted string"}, "\"foo\"");
  }

  Token token = Consume();
  RemoveEscapes(token.text(), std::back_inserter(*text));
  if (!IsValidUtf8(text->data(), text->length())) {
    Error(token.loc, "quoted string has an invalid utf-8 encoding");
  }
  return Result::Ok;
}